

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

int attr_counter_inc(attr_counter **top,attr_counter *ac,attr_counter *last,mtree_entry_conflict *me
                    )

{
  int iVar1;
  attr_counter *paVar2;
  int iVar3;
  attr_counter *paVar4;
  attr_counter *paVar5;
  
  if (ac == (attr_counter *)0x0) {
    paVar4 = attr_counter_new(me,last);
    if (paVar4 == (attr_counter *)0x0) {
      iVar3 = -1;
    }
    else {
      last->next = paVar4;
      iVar3 = 0;
    }
  }
  else {
    iVar1 = ac->count;
    ac->count = iVar1 + 1;
    iVar3 = 0;
    if ((*top != ac) && (paVar4 = ac->prev, paVar5 = paVar4, iVar3 = 0, paVar4->count <= iVar1)) {
      for (; (paVar5 != (attr_counter *)0x0 && (paVar5->count <= iVar1)); paVar5 = paVar5->prev) {
      }
      paVar2 = ac->next;
      paVar4->next = paVar2;
      if (paVar2 != (attr_counter *)0x0) {
        paVar2->prev = paVar4;
      }
      if (paVar5 == (attr_counter *)0x0) {
        ac->prev = (attr_counter *)0x0;
        ac->next = *top;
        *top = ac;
        paVar4 = ac->next;
      }
      else {
        ac->prev = paVar5;
        ac->next = paVar5->next;
        paVar5->next = ac;
        paVar4 = ac->next;
        if (paVar4 == (attr_counter *)0x0) {
          return 0;
        }
      }
      paVar4->prev = ac;
    }
  }
  return iVar3;
}

Assistant:

static int
attr_counter_inc(struct attr_counter **top, struct attr_counter *ac,
    struct attr_counter *last, struct mtree_entry *me)
{
	struct attr_counter *pac;

	if (ac != NULL) {
		ac->count++;
		if (*top == ac || ac->prev->count >= ac->count)
			return (0);
		for (pac = ac->prev; pac; pac = pac->prev) {
			if (pac->count >= ac->count)
				break;
		}
		ac->prev->next = ac->next;
		if (ac->next != NULL)
			ac->next->prev = ac->prev;
		if (pac != NULL) {
			ac->prev = pac;
			ac->next = pac->next;
			pac->next = ac;
			if (ac->next != NULL)
				ac->next->prev = ac;
		} else {
			ac->prev = NULL;
			ac->next = *top;
			*top = ac;
			ac->next->prev = ac;
		}
	} else {
		ac = attr_counter_new(me, last);
		if (ac == NULL)
			return (-1);
		last->next = ac;
	}
	return (0);
}